

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<false,_false,_false>::change_branch_(DaTrie<false,_false,_false> *this,Query *query)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer *ppcVar1;
  uint uVar2;
  pointer pBVar3;
  iterator iVar4;
  pointer pcVar5;
  char cVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  Bc BVar11;
  long lVar12;
  Edge edge;
  byte local_141;
  Bc local_140;
  Edge local_138;
  
  memset(&local_138,0,0x108);
  edge_(this,query->node_pos_,&local_138,2);
  if (local_138.size_ == 1) {
    pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (uint)local_138.labels_[0] ^ *(uint *)(pBVar3 + query->node_pos_) & 0x7fffffff;
    BVar11 = pBVar3[uVar10];
    if (BVar11._0_4_ < 0) {
      unfix_(this,uVar10,&this->blocks_);
      uVar10 = query->node_pos_;
      if (uVar10 == 0) {
        uVar8 = 0;
        lVar12 = 0;
      }
      else {
        lVar12 = 0;
        local_140 = BVar11;
        do {
          uVar10 = *(uint *)&(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar10].field_0x4 & 0x7fffffff
          ;
          sVar7 = edge_size_(this,uVar10,2);
          uVar8 = (ulong)query->node_pos_;
          BVar11 = local_140;
          if (sVar7 != 1) goto LAB_00115fcd;
          unfix_(this,query->node_pos_,&this->blocks_);
          query->node_pos_ = uVar10;
          query->is_finished_ = false;
          query->pos_ = query->pos_ - 1;
          lVar12 = lVar12 + 1;
        } while (uVar10 != 0);
        uVar8 = 0;
        BVar11 = local_140;
      }
LAB_00115fcd:
      pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = &this->tail_;
      pBVar3[uVar8] =
           (Bc)(CONCAT44(*(undefined4 *)&pBVar3[uVar8].field_0x4,
                         *(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) | 0x80000000);
      if (lVar12 != 0) {
        pcVar9 = query->key_;
        uVar10 = query->pos_;
        do {
          iVar4._M_current =
               (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar4,pcVar9 + uVar10);
          }
          else {
            *iVar4._M_current = pcVar9[uVar10];
            ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          lVar12 = lVar12 + -1;
          pcVar9 = query->key_;
          uVar2 = query->pos_;
          uVar10 = uVar2 + 1;
          query->pos_ = uVar10;
          query->is_finished_ = pcVar9[uVar2] == '\0';
        } while (lVar12 != 0);
      }
      local_141 = local_138.labels_[0];
      iVar4._M_current =
           (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  (this_00,iVar4,(char *)&local_141);
      }
      else {
        *iVar4._M_current = local_138.labels_[0];
        ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      uVar8 = (ulong)(BVar11._0_4_ & 0x7fffffff);
      if (local_138.labels_[0] == 0) {
        lVar12 = 4;
        do {
          local_141 = (byte)uVar8;
          iVar4._M_current =
               (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                      (this_00,iVar4,(char *)&local_141);
          }
          else {
            *iVar4._M_current = local_141;
            ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          uVar8 = uVar8 >> 8;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      else {
        uVar10 = BVar11._0_4_ & 0x7fffffff;
        pcVar5 = (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar9 = pcVar5 + uVar10;
        cVar6 = pcVar5[uVar10];
        while (cVar6 != '\0') {
          iVar4._M_current =
               (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar4,pcVar9);
          }
          else {
            *iVar4._M_current = cVar6;
            ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          uVar8 = (ulong)((int)uVar8 + 1);
          this->tail_emps_ = this->tail_emps_ + 1;
          pcVar5 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar9 = pcVar5 + uVar8;
          cVar6 = pcVar5[uVar8];
        }
        iVar4._M_current =
             (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)this_00,iVar4,pcVar9);
        }
        else {
          *iVar4._M_current = '\0';
          ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        this->tail_emps_ = this->tail_emps_ + 1;
        lVar12 = 0;
        do {
          pcVar9 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + (uint)((int)lVar12 + (int)uVar8 + 1);
          iVar4._M_current =
               (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar4,pcVar9);
          }
          else {
            *iVar4._M_current = *pcVar9;
            ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          this->tail_emps_ = this->tail_emps_ + 1;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
      }
    }
  }
  return;
}

Assistant:

void change_branch_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    Edge edge;
    edge_(query.node_pos(), edge, 2);

    if (edge.size() != 1) {
      return;
    }

    auto child_pos = bc_[query.node_pos()].base() ^*edge.begin();
    if (!bc_[child_pos].is_leaf()) {
      return;
    }

    auto value = bc_[child_pos].value();
    unfix_(child_pos, blocks_);

    size_t num_regress = 0;
    while (query.node_pos() != ROOT_POS) {
      auto parent_pos = bc_[query.node_pos()].check();
      if (edge_size_(parent_pos, 2) != 1) {
        break;
      }
      if (WithNLM) {
        delete_sib_(query.node_pos());
      }
      unfix_(query.node_pos(), blocks_);
      query.prev(parent_pos);
      ++num_regress;
    }

    bc_[query.node_pos()].set_value(tail_size());
    while (0 < num_regress--) {
      tail_.push_back(*query.key());
      query.next();
    }
    tail_.push_back(*edge.begin());

    if (*edge.begin() != '\0') {
      while (tail_[value] != '\0') {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
      tail_.push_back(tail_[value++]);
      ++tail_emps_;
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
    } else {
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(static_cast<uint8_t>(value & 0xFF));
        value >>= 8;
      }
    }
  }